

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_varg(jit_State *J,BCReg dst,ptrdiff_t nresults)

{
  byte bVar1;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  IRRef1 IVar6;
  TRef TVar7;
  TRef TVar8;
  TRef TVar9;
  uint uVar10;
  TRef *pTVar11;
  long lVar12;
  IROpT IVar13;
  ulong uVar14;
  int k;
  int32_t iVar15;
  GCobj *o;
  long lVar16;
  uint uVar17;
  long lVar18;
  IRRef1 IVar19;
  ulong uVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  TRef local_64;
  
  uVar20 = (ulong)dst;
  bVar1 = J->pt->numparams;
  lVar18 = J->L->base[-1].it64 >> 3;
  uVar14 = ~(ulong)bVar1;
  if (J->maxslot < dst) {
    J->base[dst - 1] = 0;
  }
  lVar16 = (uVar14 - 1) + lVar18;
  if (0 < J->framedepth) {
    lVar18 = 0;
    if (0 < lVar16) {
      lVar18 = lVar16;
    }
    lVar12 = lVar18;
    if ((nresults == -1) ||
       (uVar10 = J->maxslot, lVar12 = nresults, (long)(ulong)uVar10 < (long)(uVar20 + nresults))) {
      uVar10 = (int)lVar12 + dst;
      J->maxslot = uVar10;
    }
    if (0 < lVar12) {
      pTVar11 = J->base;
      lVar21 = 0;
      do {
        TVar7 = 0x7fff;
        if ((lVar21 < lVar16) && (TVar7 = pTVar11[(lVar21 + -2) - lVar18], TVar7 == 0)) {
          TVar7 = sload(J,(int)lVar21 + (-2 - (int)lVar18));
          pTVar11 = J->base;
        }
        pTVar11[uVar20 + lVar21] = TVar7;
        lVar21 = lVar21 + 1;
      } while (lVar12 != lVar21);
      uVar10 = J->maxslot;
    }
    goto LAB_00131e12;
  }
  uVar14 = uVar14 + lVar18;
  (J->fold).ins.field_0.ot = 0x4713;
  (J->fold).ins.field_1.op12 = 0x120001;
  TVar7 = lj_opt_fold(J);
  uVar10 = (uint)bVar1;
  k = uVar10 * 8 + 0x13;
  IVar19 = (IRRef1)TVar7;
  if (-1 < nresults) {
    if ((long)uVar14 < 2) {
      TVar7 = lj_ir_kint(J,k);
      (J->fold).ins.field_0.ot = 0x293;
      (J->fold).ins.field_0.op1 = IVar19;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      lj_opt_fold(J);
      lVar16 = 0;
    }
    else {
      if ((ulong)nresults < uVar14) {
        iVar15 = k + (int)nresults * 8;
        IVar13 = 0x193;
        lVar12 = nresults;
      }
      else {
        iVar15 = J->L->base[-1].field_4.i;
        IVar13 = 0x893;
        lVar12 = lVar16;
      }
      TVar7 = lj_ir_kint(J,iVar15);
      (J->fold).ins.field_0.ot = IVar13;
      (J->fold).ins.field_0.op1 = IVar19;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2a15;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = IVar19;
      TVar7 = lj_opt_fold(J);
      TVar8 = lj_ir_kint(J,uVar10 * 8 + 0xb);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      TVar7 = lj_opt_fold(J);
      if (lVar12 != 0) {
        lVar21 = 0;
        do {
          lVar3 = J->L->base[((ulong)bVar1 + lVar21) - lVar18].it64;
          uVar10 = ~(uint)(lVar3 >> 0x2f);
          if ((ulong)(lVar3 >> 0x2f) < 0xfffffffffffffff2) {
            uVar10 = 0xe;
          }
          (J->fold).ins.field_0.ot = (ushort)uVar10 | 0x4880;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
          (J->fold).ins.field_0.op2 = (IRRef1)lVar21;
          TVar9 = lj_opt_fold(J);
          TVar8 = uVar10 * 0xffffff + 0x7fff;
          if (2 < uVar10) {
            TVar8 = TVar9;
          }
          J->base[uVar20 + lVar21] = TVar8;
          lVar21 = lVar21 + 1;
        } while (lVar12 != lVar21);
      }
    }
    auVar5 = _DAT_001616c0;
    lVar18 = nresults - lVar16;
    if (lVar18 != 0 && lVar16 <= nresults) {
      pTVar11 = J->base;
      lVar12 = lVar18 + -1;
      auVar22._8_4_ = (int)lVar12;
      auVar22._0_8_ = lVar12;
      auVar22._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar14 = 0;
      auVar23 = pmovsxbq(in_XMM1,0x302);
      auVar24 = pmovsxbq(in_XMM2,0x100);
      auVar22 = auVar22 ^ _DAT_001616c0;
      do {
        uVar4 = auVar5._0_8_;
        lVar12 = auVar22._0_8_;
        if ((bool)(~(lVar12 < (long)(uVar14 ^ uVar4)) & 1)) {
          pTVar11[lVar16 + uVar20 + uVar14] = 0x7fff;
        }
        auVar25._8_4_ = (int)uVar14;
        auVar25._0_8_ = uVar14;
        auVar25._12_4_ = (int)(uVar14 >> 0x20);
        if ((long)((auVar25._8_8_ | auVar24._8_8_) ^ auVar5._8_8_) <= auVar22._8_8_) {
          pTVar11[lVar16 + uVar20 + uVar14 + 1] = 0x7fff;
        }
        if ((long)((uVar14 | auVar23._0_8_) ^ uVar4) <= lVar12) {
          pTVar11[lVar16 + uVar20 + uVar14 + 2] = 0x7fff;
          pTVar11[lVar16 + uVar20 + uVar14 + 3] = 0x7fff;
        }
        uVar14 = uVar14 + 4;
      } while ((lVar18 + 3U & 0xfffffffffffffffc) != uVar14);
    }
    uVar17 = (int)nresults + dst;
    uVar10 = J->maxslot;
    if (J->maxslot < uVar17) {
      J->maxslot = uVar17;
      uVar10 = uVar17;
    }
    goto LAB_00131e12;
  }
  if ((J->pc[1] & 0xffff00ff) != 0x2010041) {
LAB_00131e3c:
    (J->errinfo).u64 = 0x4051c00000000000;
    lj_trace_err_info(J,LJ_TRERR_NYIBC);
  }
  uVar17 = J->pc[1] >> 8 & 0xff;
  aVar2 = J->L->base[uVar17].field_4;
  if ((aVar2.it >> 0xf != 0x1fff7) ||
     (o = (GCobj *)((ulong)aVar2 & 0x7fffffffffff), (o->gch).unused1 != '\x10')) goto LAB_00131e3c;
  TVar8 = lj_ir_kgc(J,o,IRT_FUNC);
  TVar7 = J->base[uVar17];
  if (TVar7 == 0) {
    TVar7 = sload(J,uVar17);
  }
  (J->fold).ins.field_0.ot = 0x888;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
  lj_opt_fold(J);
  local_64 = J->base[dst - 1];
  iVar15 = lj_ffrecord_select_mode(J,local_64,J->L->base + (dst - 1));
  if (iVar15 < 0) goto LAB_00131e3c;
  lVar18 = (long)iVar15;
  if (iVar15 == 0) {
    if (lVar18 < (long)uVar14) goto LAB_00131b79;
    TVar7 = lj_ir_kint(J,k);
    IVar6 = (IRRef1)TVar7;
    TVar7 = lj_ir_kint(J,0);
LAB_00131cca:
    (J->fold).ins.field_0.ot = 0x93;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = IVar6;
    lj_opt_fold(J);
LAB_00131cf3:
LAB_00131cf8:
    if ((iVar15 != 0) && (lVar18 < (long)uVar14)) {
      (J->fold).ins.field_0.ot = 0x2a15;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = IVar19;
      TVar7 = lj_opt_fold(J);
      TVar8 = lj_ir_kint(J,k + -0x10);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      TVar7 = lj_opt_fold(J);
      lVar18 = J->L->base[(lVar18 - uVar14) + -2].it64;
      uVar10 = 0xe;
      if (0xfffffffffffffff1 < (ulong)(lVar18 >> 0x2f)) {
        uVar10 = ~(uint)(lVar18 >> 0x2f);
      }
      (J->fold).ins.field_0.ot = 0x3809;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)local_64;
      TVar7 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = (ushort)uVar10 | 0x4880;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
      (J->fold).ins.field_0.op2 = 0;
      TVar8 = lj_opt_fold(J);
      TVar7 = uVar10 * 0xffffff + 0x7fff;
      if (2 < uVar10) {
        TVar7 = TVar8;
      }
    }
  }
  else {
    if (4 < (local_64 >> 0x18 & 0x1f) - 0xf) {
      (J->fold).ins.field_0.op1 = (IRRef1)local_64;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b93226e;
      local_64 = lj_opt_fold(J);
    }
    if (-1 < (short)(IRRef1)local_64) {
      TVar7 = lj_ir_kint(J,k + iVar15 * 8);
      (J->fold).ins.field_0.ot = (ushort)(lVar18 < (long)uVar14) << 8 | 0x93;
      (J->fold).ins.field_0.op1 = IVar19;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      lj_opt_fold(J);
      k = uVar10 * 8 + 0xb;
      TVar7 = 0x7fff;
      goto LAB_00131cf8;
    }
    if ((long)uVar14 <= lVar18) {
      TVar7 = lj_ir_kint(J,k);
      TVar8 = lj_ir_kint(J,3);
      (J->fold).ins.field_0.ot = 0x2413;
      (J->fold).ins.field_0.op1 = (IRRef1)local_64;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      TVar8 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2913;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      TVar7 = lj_opt_fold(J);
      IVar6 = (IRRef1)TVar7;
      TVar7 = 0x7fff;
      goto LAB_00131cca;
    }
LAB_00131b79:
    TVar7 = lj_ir_kint(J,uVar10 * -8 + -0x13);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = IVar19;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    TVar7 = lj_opt_fold(J);
    if (bVar1 != 0) {
      TVar8 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x193;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      lj_opt_fold(J);
    }
    TVar8 = lj_ir_kint(J,3);
    (J->fold).ins.field_0.ot = 0x2513;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
    TVar7 = lj_opt_fold(J);
    if (iVar15 != 0) {
      TVar8 = lj_ir_kint(J,-1);
      (J->fold).ins.field_0.ot = 0x2913;
      (J->fold).ins.field_0.op1 = (IRRef1)local_64;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      local_64 = lj_opt_fold(J);
      rec_idx_abc(J,TVar7,local_64,(uint32_t)lVar16);
      goto LAB_00131cf3;
    }
  }
  J->base[dst - 3] = TVar7;
  uVar10 = dst - 2;
  J->maxslot = uVar10;
  J->bcskip = '\x02';
LAB_00131e12:
  if (uVar10 + J->baseslot < 0xfa) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_STACKOV);
}

Assistant:

static void rec_varg(jit_State *J, BCReg dst, ptrdiff_t nresults)
{
  int32_t numparams = J->pt->numparams;
  ptrdiff_t nvararg = frame_delta(J->L->base-1) - numparams - 1 - LJ_FR2;
  lj_assertJ(frame_isvarg(J->L->base-1), "VARG in non-vararg frame");
  if (LJ_FR2 && dst > J->maxslot)
    J->base[dst-1] = 0;  /* Prevent resurrection of unrelated slot. */
  if (J->framedepth > 0) {  /* Simple case: varargs defined on-trace. */
    ptrdiff_t i;
    if (nvararg < 0) nvararg = 0;
    if (nresults == -1) {
      nresults = nvararg;
      J->maxslot = dst + (BCReg)nvararg;
    } else if (dst + nresults > J->maxslot) {
      J->maxslot = dst + (BCReg)nresults;
    }
    for (i = 0; i < nresults; i++)
      J->base[dst+i] = i < nvararg ? getslot(J, i - nvararg - 1 - LJ_FR2) : TREF_NIL;
  } else {  /* Unknown number of varargs passed to trace. */
    TRef fr = emitir(IRTI(IR_SLOAD), LJ_FR2, IRSLOAD_READONLY|IRSLOAD_FRAME);
    int32_t frofs = 8*(1+LJ_FR2+numparams)+FRAME_VARG;
    if (nresults >= 0) {  /* Known fixed number of results. */
      ptrdiff_t i;
      if (nvararg > 0) {
	ptrdiff_t nload = nvararg >= nresults ? nresults : nvararg;
	TRef vbase;
	if (nvararg >= nresults)
	  emitir(IRTGI(IR_GE), fr, lj_ir_kint(J, frofs+8*(int32_t)nresults));
	else
	  emitir(IRTGI(IR_EQ), fr,
		 lj_ir_kint(J, (int32_t)frame_ftsz(J->L->base-1)));
	vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase, lj_ir_kint(J, frofs-8));
	for (i = 0; i < nload; i++) {
	  IRType t = itype2irt(&J->L->base[i-1-LJ_FR2-nvararg]);
	  J->base[dst+i] = lj_record_vload(J, vbase, i, t);
	}
      } else {
	emitir(IRTGI(IR_LE), fr, lj_ir_kint(J, frofs));
	nvararg = 0;
      }
      for (i = nvararg; i < nresults; i++)
	J->base[dst+i] = TREF_NIL;
      if (dst + (BCReg)nresults > J->maxslot)
	J->maxslot = dst + (BCReg)nresults;
    } else if (select_detect(J)) {  /* y = select(x, ...) */
      TRef tridx = J->base[dst-1];
      TRef tr = TREF_NIL;
      ptrdiff_t idx = lj_ffrecord_select_mode(J, tridx, &J->L->base[dst-1]);
      if (idx < 0) goto nyivarg;
      if (idx != 0 && !tref_isinteger(tridx))
	tridx = emitir(IRTGI(IR_CONV), tridx, IRCONV_INT_NUM|IRCONV_INDEX);
      if (idx != 0 && tref_isk(tridx)) {
	emitir(IRTGI(idx <= nvararg ? IR_GE : IR_LT),
	       fr, lj_ir_kint(J, frofs+8*(int32_t)idx));
	frofs -= 8;  /* Bias for 1-based index. */
      } else if (idx <= nvararg) {  /* Compute size. */
	TRef tmp = emitir(IRTI(IR_ADD), fr, lj_ir_kint(J, -frofs));
	if (numparams)
	  emitir(IRTGI(IR_GE), tmp, lj_ir_kint(J, 0));
	tr = emitir(IRTI(IR_BSHR), tmp, lj_ir_kint(J, 3));
	if (idx != 0) {
	  tridx = emitir(IRTI(IR_ADD), tridx, lj_ir_kint(J, -1));
	  rec_idx_abc(J, tr, tridx, (uint32_t)nvararg);
	}
      } else {
	TRef tmp = lj_ir_kint(J, frofs);
	if (idx != 0) {
	  TRef tmp2 = emitir(IRTI(IR_BSHL), tridx, lj_ir_kint(J, 3));
	  tmp = emitir(IRTI(IR_ADD), tmp2, tmp);
	} else {
	  tr = lj_ir_kint(J, 0);
	}
	emitir(IRTGI(IR_LT), fr, tmp);
      }
      if (idx != 0 && idx <= nvararg) {
	IRType t;
	TRef aref, vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase,
		       lj_ir_kint(J, frofs-(8<<LJ_FR2)));
	t = itype2irt(&J->L->base[idx-2-LJ_FR2-nvararg]);
	aref = emitir(IRT(IR_AREF, IRT_PGC), vbase, tridx);
	tr = lj_record_vload(J, aref, 0, t);
      }
      J->base[dst-2-LJ_FR2] = tr;
      J->maxslot = dst-1-LJ_FR2;
      J->bcskip = 2;  /* Skip CALLM + select. */
    } else {
    nyivarg:
      setintV(&J->errinfo, BC_VARG);
      lj_trace_err_info(J, LJ_TRERR_NYIBC);
    }
  }
  if (J->baseslot + J->maxslot >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
}